

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::call_a16<(SM83::Conditions)0>(SM83 *this)

{
  bool bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_const_unsigned_short_&>
  fmt;
  u16 local_12;
  SM83 *pSStack_10;
  u16 address;
  SM83 *this_local;
  
  pSStack_10 = this;
  local_12 = GetWordFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4b;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short_const&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  CALL 0x{:04X}\n",
             fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,&local_12,(unsigned_short *)this);
  bVar1 = MeetsCondition<(SM83::Conditions)0>(this);
  if (bVar1) {
    StackPush(this,this->pc);
    this->pc = local_12;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::call_a16() {
    const u16 address = GetWordFromPC();

    if constexpr (cond == Conditions::None) {
        LTRACE("CALL 0x{:04X}", address);
    } else {
        LTRACE("CALL {}, 0x{:04X}", GetConditionString<cond>(), address);
    }

    if (MeetsCondition<cond>()) {
        StackPush(pc);
        pc = address;
        timer.AdvanceCycles(4);
    }
}